

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O2

Span<const_unsigned_char,_18446744073709551615UL> __thiscall
MILBlob::Blob::StorageReader::Impl::GetDataView<unsigned_char>(Impl *this,uint64_t offset)

{
  uchar *ptr;
  pointer ptVar1;
  runtime_error *this_00;
  unsigned_long size;
  Span<const_unsigned_char,_18446744073709551615UL> SVar2;
  blob_metadata metadata;
  
  GetMetadata(&metadata,this,offset);
  if (metadata.mil_dtype == UInt8) {
    SVar2 = MMapFileReader::ReadData
                      ((this->m_reader)._M_t.
                       super___uniq_ptr_impl<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_MILBlob::Blob::MMapFileReader_*,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                       .super__Head_base<0UL,_const_MILBlob::Blob::MMapFileReader_*,_false>.
                       _M_head_impl,metadata.offset,metadata.sizeInBytes);
    ptVar1 = SVar2.m_ptr;
    if (SVar2.m_size.m_size == 0) {
      ptVar1 = (pointer)0x0;
    }
    SVar2.m_ptr = ptVar1;
    return SVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Metadata data type does not match requested type.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Util::Span<const T> StorageReader::Impl::GetDataView(uint64_t offset) const
{
    auto metadata = GetMetadata(offset);

    MILVerifyIsTrue(metadata.mil_dtype == BlobDataTypeTraits<T>::DataType,
                    std::runtime_error,
                    "Metadata data type does not match requested type.");
    return Util::SpanCast<const T>(m_reader->ReadData(metadata.offset, metadata.sizeInBytes));
}